

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O2

void __thiscall CVmObjPattern::post_load_init(CVmObjPattern *this,vm_obj_id_t self)

{
  ushort *puVar1;
  re_compiled_pattern **pattern;
  char *pcVar2;
  
  pcVar2 = (this->super_CVmObject).ext_;
  if (*(int *)(pcVar2 + 8) == 5) {
    CVmObjTable::ensure_post_load_init(&G_obj_table_X,*(vm_obj_id_t *)(pcVar2 + 0x10));
    pcVar2 = (this->super_CVmObject).ext_;
  }
  puVar1 = (ushort *)vm_val_t::get_as_string((vm_val_t *)(pcVar2 + 8));
  if (puVar1 != (ushort *)0x0) {
    pattern = (re_compiled_pattern **)(this->super_CVmObject).ext_;
    if (*pattern != (re_compiled_pattern *)0x0) {
      CRegexParser::free_pattern(*pattern);
      pattern = (re_compiled_pattern **)(this->super_CVmObject).ext_;
    }
    CRegexParser::compile_pattern
              (G_bif_tads_globals_X->rex_parser,(char *)(puVar1 + 1),(ulong)*puVar1,pattern);
    return;
  }
  return;
}

Assistant:

void CVmObjPattern::post_load_init(VMG_ vm_obj_id_t self)
{
    /* make sure the original string object is initialized */
    const vm_val_t *origval = get_orig_str();
    if (origval->typ == VM_OBJ)
        G_obj_table->ensure_post_load_init(vmg_ origval->val.obj);

    /* get the string value */
    const char *strval = get_orig_str()->get_as_string(vmg0_);
    if (strval != 0)
    {
        /* if we already have a compiled pattern, delete it */
        if (get_ext()->pat != 0)
            CRegexParser::free_pattern(get_ext()->pat);

        /* compile the pattern and store the result */
        G_bif_tads_globals->rex_parser->compile_pattern(
            strval + VMB_LEN, vmb_get_len(strval), &get_ext()->pat);
    }
}